

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LogStream.cc
# Opt level: O0

void __thiscall tt::LogStream::formatInteger<int>(LogStream *this,int v)

{
  int iVar1;
  char *buf;
  size_t len_00;
  size_t len;
  int v_local;
  LogStream *this_local;
  
  iVar1 = detail::FixedBuffer<4000>::avail(&this->m_buffer);
  if (0x1f < iVar1) {
    buf = detail::FixedBuffer<4000>::current(&this->m_buffer);
    len_00 = detail::convert<int>(buf,v);
    detail::FixedBuffer<4000>::add(&this->m_buffer,len_00);
  }
  return;
}

Assistant:

void LogStream::formatInteger(T v){
	if(m_buffer.avail() >= kMaxNumbericSize){ //把整数变成字符串存入
		size_t len = convert(m_buffer.current(), v);
		m_buffer.add(len);
	}

}